

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeString(ExpressionContext *ctx,SynString *syntax)

{
  char *pcVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  undefined4 extraout_var;
  ulong uVar7;
  ExprBase *pEVar8;
  TypeArray *pTVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  uchar *puVar13;
  uchar *str;
  ulong uVar14;
  _func_int **pp_Var6;
  undefined4 extraout_var_00;
  
  if ((syntax->super_SynBase).field_0x3a == '\x01') {
    uVar3 = *(int *)&(syntax->value).end - *(int *)&(syntax->value).begin;
    uVar14 = 0;
    if (1 < uVar3) {
      uVar14 = (ulong)(uVar3 - 2);
    }
  }
  else {
    pcVar10 = (syntax->value).begin;
    pcVar5 = (syntax->value).end + -1;
    pcVar11 = pcVar10 + 1;
    uVar14 = 0;
    if (pcVar11 < pcVar5) {
      uVar14 = 0;
      do {
        if (pcVar10[1] == '\\') {
          pcVar11 = pcVar10 + 2;
        }
        uVar14 = (ulong)((int)uVar14 + 1);
        pcVar1 = pcVar11 + 1;
        pcVar10 = pcVar11;
        pcVar11 = pcVar1;
      } while (pcVar1 < pcVar5);
    }
  }
  uVar3 = (uint)uVar14;
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
  pp_Var6 = (_func_int **)CONCAT44(extraout_var,iVar4);
  if (uVar3 < (uVar3 & 0xfffffffc) + 4) {
    memset((void *)((long)pp_Var6 + uVar14),0,(ulong)(4 - (uVar3 & 3)));
  }
  if ((syntax->super_SynBase).field_0x3a == '\x01') {
    if (uVar3 == 0) {
      uVar14 = 0;
    }
    else {
      uVar7 = 0;
      do {
        *(char *)((long)pp_Var6 + uVar7) = (syntax->value).begin[uVar7 + 1];
        uVar7 = uVar7 + 1;
      } while (uVar14 != uVar7);
    }
  }
  else {
    str = (uchar *)((syntax->value).begin + 1);
    puVar13 = (uchar *)((syntax->value).end + -1);
    if (str < puVar13) {
      uVar7 = 0;
      do {
        uVar2 = *str;
        lVar12 = 1;
        if (uVar2 == '\\') {
          uVar2 = anon_unknown.dwarf_9c70f::ParseEscapeSequence
                            (ctx,&syntax->super_SynBase,(char *)str);
          lVar12 = 2;
        }
        *(uchar *)((long)pp_Var6 + uVar7) = uVar2;
        str = str + lVar12;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (str < puVar13);
    }
  }
  *(undefined1 *)((long)pp_Var6 + uVar14) = 0;
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
  pTVar9 = ExpressionContext::GetArrayType(ctx,ctx->typeChar,(ulong)(uVar3 + 1));
  pEVar8->typeID = 5;
  pEVar8->source = &syntax->super_SynBase;
  pEVar8->type = &pTVar9->super_TypeBase;
  pEVar8->next = (ExprBase *)0x0;
  pEVar8->listed = false;
  pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002236d0;
  pEVar8[1]._vptr_ExprBase = pp_Var6;
  pEVar8[1].typeID = uVar3;
  return pEVar8;
}

Assistant:

ExprBase* AnalyzeString(ExpressionContext &ctx, SynString *syntax)
{
	unsigned length = 0;

	if(syntax->rawLiteral)
	{
		if(syntax->value.length() >= 2)
			length = syntax->value.length() - 2;
	}
	else
	{
		// Find the length of the string with collapsed escape-sequences
		for(const char *curr = syntax->value.begin + 1, *end = syntax->value.end - 1; curr < end; curr++, length++)
		{
			if(*curr == '\\')
				curr++;
		}
	}

	unsigned memory = length ? ((length + 1) + 3) & ~3 : 4;

	char *value = (char*)ctx.allocator->alloc(memory);

	for(unsigned i = length; i < memory; i++)
		value[i] = 0;

	if(syntax->rawLiteral)
	{
		for(unsigned i = 0; i < length; i++)
			value[i] = syntax->value.begin[i + 1];

		value[length] = 0;
	}
	else
	{
		unsigned i = 0;

		// Find the length of the string with collapsed escape-sequences
		for(const char *curr = syntax->value.begin + 1, *end = syntax->value.end - 1; curr < end;)
		{
			if(*curr == '\\')
			{
				value[i++] = ParseEscapeSequence(ctx, syntax, curr);
				curr += 2;
			}
			else
			{
				value[i++] = *curr;
				curr += 1;
			}
		}

		value[length] = 0;
	}

	return new (ctx.get<ExprStringLiteral>()) ExprStringLiteral(syntax, ctx.GetArrayType(ctx.typeChar, length + 1), value, length);
}